

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O1

void __thiscall FNodeBuilder::RemoveSegFromVert2(FNodeBuilder *this,DWORD segnum,int vertnum)

{
  FPrivVert *pFVar1;
  FPrivSeg *pFVar2;
  uint uVar3;
  ulong uVar4;
  
  pFVar1 = (this->Vertices).Array;
  uVar3 = pFVar1[vertnum].segs2;
  if (uVar3 == segnum) {
    pFVar1[vertnum].segs2 = (this->Segs).Array[segnum].nextforvert2;
    return;
  }
  if (uVar3 == 0xffffffff) {
    uVar4 = 0;
    uVar3 = 0xffffffff;
  }
  else {
    do {
      uVar4 = (ulong)uVar3;
      uVar3 = (this->Segs).Array[uVar4].nextforvert2;
      if (uVar3 == 0xffffffff) break;
    } while (uVar3 != segnum);
  }
  if (uVar3 == segnum) {
    pFVar2 = (this->Segs).Array;
    pFVar2[uVar4].nextforvert2 = pFVar2[uVar3].nextforvert2;
  }
  return;
}

Assistant:

void FNodeBuilder::RemoveSegFromVert2 (DWORD segnum, int vertnum)
{
	FPrivVert *v = &Vertices[vertnum];

	if (v->segs2 == segnum)
	{
		v->segs2 = Segs[segnum].nextforvert2;
	}
	else
	{
		DWORD prev, curr;
		prev = 0;
		curr = v->segs2;
		while (curr != DWORD_MAX && curr != segnum)
		{
			prev = curr;
			curr = Segs[curr].nextforvert2;
		}
		if (curr == segnum)
		{
			Segs[prev].nextforvert2 = Segs[curr].nextforvert2;
		}
	}
}